

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O2

void __thiscall dd::ProcessThreadImpl::~ProcessThreadImpl(ProcessThreadImpl *this)

{
  pointer pDVar1;
  QueuedTask *pQVar2;
  _Elt_pointer ppQVar3;
  uint __line;
  bool bVar4;
  char *__assertion;
  
  (this->super_ProcessThread).super_TaskQueueBase._vptr_TaskQueueBase =
       (_func_int **)&PTR_Delete_00137b28;
  bVar4 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_thread_checker);
  if (bVar4) {
    if ((this->_thread)._M_t.
        super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
        super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
        super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl == (PlatformThread *)0x0) {
      if (this->_stop == false) {
        while (pDVar1 = (this->_delayed_tasks).c.
                        super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              pDVar1 != (this->_delayed_tasks).c.
                        super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
          pQVar2 = pDVar1->task;
          if (pQVar2 != (QueuedTask *)0x0) {
            (*pQVar2->_vptr_QueuedTask[1])();
          }
          std::
          priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
          ::pop(&this->_delayed_tasks);
        }
        while (ppQVar3 = (this->_queue).c.
                         super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_cur,
              (this->_queue).c.
              super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur != ppQVar3) {
          pQVar2 = *ppQVar3;
          if (pQVar2 != (QueuedTask *)0x0) {
            (*pQVar2->_vptr_QueuedTask[1])();
          }
          std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>::pop_front
                    (&(this->_queue).c);
        }
        std::
        _Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
        ::~_Vector_base((_Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                         *)&this->_delayed_tasks);
        std::_Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>::~_Deque_base
                  ((_Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_> *)&this->_queue
                  );
        std::__cxx11::
        _List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
        ::_M_clear(&(this->_modules).
                    super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
                  );
        std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::~unique_ptr
                  (&this->_thread);
        Event::~Event(&this->_wake_up);
        SequenceCheckerImpl::~SequenceCheckerImpl((SequenceCheckerImpl *)&this->_thread_checker);
        pthread_mutex_destroy((pthread_mutex_t *)&this->_lock);
        return;
      }
      __assertion = "!_stop";
      __line = 0x1c;
    }
    else {
      __assertion = "!_thread.get()";
      __line = 0x1b;
    }
  }
  else {
    __assertion = "_thread_checker.IsCurrent()";
    __line = 0x1a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                ,__line,"virtual dd::ProcessThreadImpl::~ProcessThreadImpl()");
}

Assistant:

ProcessThreadImpl::~ProcessThreadImpl() {
		assert(_thread_checker.IsCurrent());
		assert(!_thread.get());
		assert(!_stop);
		while (!_delayed_tasks.empty()) {
			delete _delayed_tasks.top().task;
			_delayed_tasks.pop();
		}

		while (!_queue.empty()) {
			delete _queue.front();
			_queue.pop();
		}
	}